

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O1

int run_test_fs_chown(void)

{
  undefined8 uVar1;
  ssize_t sVar2;
  int iVar3;
  int extraout_EAX;
  __uid_t _Var4;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  int extraout_EAX_03;
  int extraout_EAX_04;
  uv_loop_t *puVar5;
  void *pvVar6;
  uv_file file;
  uv_loop_t *puVar7;
  uv_loop_t *req_00;
  char *loop;
  _func_void *unaff_R14;
  _func_void *p_Var8;
  _func_void *p_Var9;
  _func_void *p_Var10;
  _func_void *p_Var11;
  uv_buf_t uVar12;
  uv_fs_t req;
  uv_fs_t uStackY_588;
  uv_loop_t *puStackY_3d0;
  code *pcStackY_3c8;
  undefined1 auStack_3b0 [488];
  uv_fs_t uStack_1c8;
  
  p_Var8 = (_func_void *)(auStack_3b0 + 0x1e8);
  p_Var9 = (_func_void *)(auStack_3b0 + 0x1e8);
  p_Var10 = (_func_void *)(auStack_3b0 + 0x1e8);
  p_Var11 = (_func_void *)(auStack_3b0 + 0x1e8);
  puVar7 = (uv_loop_t *)0x194385;
  auStack_3b0._480_8_ = (void *)0x152dd8;
  unlink("test_file");
  auStack_3b0._480_8_ = (void *)0x152de4;
  unlink("test_file_link");
  auStack_3b0._480_8_ = (void *)0x152de9;
  ::loop = uv_default_loop();
  puVar5 = (uv_loop_t *)0x0;
  auStack_3b0._480_8_ = (void *)0x152e0b;
  iVar3 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)(auStack_3b0 + 0x1e8),"test_file",0x42,0x180,
                     (uv_fs_cb)0x0);
  sVar2 = uStack_1c8.result;
  if (iVar3 < 0) {
    auStack_3b0._480_8_ = (void *)0x1530dc;
    run_test_fs_chown_cold_1();
LAB_001530dc:
    auStack_3b0._480_8_ = (void *)0x1530e1;
    run_test_fs_chown_cold_2();
LAB_001530e1:
    auStack_3b0._480_8_ = (void *)0x1530e6;
    run_test_fs_chown_cold_3();
LAB_001530e6:
    p_Var8 = unaff_R14;
    auStack_3b0._480_8_ = (void *)0x1530eb;
    run_test_fs_chown_cold_4();
LAB_001530eb:
    auStack_3b0._480_8_ = (void *)0x1530f0;
    run_test_fs_chown_cold_5();
LAB_001530f0:
    p_Var9 = p_Var8;
    auStack_3b0._480_8_ = (void *)0x1530f5;
    run_test_fs_chown_cold_6();
LAB_001530f5:
    auStack_3b0._480_8_ = (void *)0x1530fa;
    run_test_fs_chown_cold_7();
LAB_001530fa:
    auStack_3b0._480_8_ = (void *)0x1530ff;
    run_test_fs_chown_cold_8();
LAB_001530ff:
    auStack_3b0._480_8_ = (void *)0x153104;
    run_test_fs_chown_cold_9();
LAB_00153104:
    auStack_3b0._480_8_ = (void *)0x153109;
    run_test_fs_chown_cold_10();
LAB_00153109:
    auStack_3b0._480_8_ = (void *)0x15310e;
    run_test_fs_chown_cold_11();
LAB_0015310e:
    auStack_3b0._480_8_ = (void *)0x153113;
    run_test_fs_chown_cold_12();
LAB_00153113:
    auStack_3b0._480_8_ = (void *)0x153118;
    run_test_fs_chown_cold_13();
LAB_00153118:
    p_Var10 = p_Var9;
    auStack_3b0._480_8_ = (void *)0x15311d;
    run_test_fs_chown_cold_14();
LAB_0015311d:
    auStack_3b0._480_8_ = (void *)0x153122;
    run_test_fs_chown_cold_15();
LAB_00153122:
    p_Var11 = p_Var10;
    auStack_3b0._480_8_ = (void *)0x153127;
    run_test_fs_chown_cold_16();
LAB_00153127:
    auStack_3b0._480_8_ = (void *)0x15312c;
    run_test_fs_chown_cold_17();
LAB_0015312c:
    auStack_3b0._480_8_ = (void *)0x153131;
    run_test_fs_chown_cold_18();
LAB_00153131:
    auStack_3b0._480_8_ = (void *)0x153136;
    run_test_fs_chown_cold_19();
LAB_00153136:
    auStack_3b0._480_8_ = (void *)0x15313b;
    run_test_fs_chown_cold_20();
  }
  else {
    puVar7 = (uv_loop_t *)uStack_1c8.result;
    if (uStack_1c8.result < 0) goto LAB_001530dc;
    auStack_3b0._480_8_ = (void *)0x152e2c;
    uv_fs_req_cleanup((uv_fs_t *)(auStack_3b0 + 0x1e8));
    puVar5 = (uv_loop_t *)0x0;
    auStack_3b0._480_8_ = (void *)0x152e4b;
    iVar3 = uv_fs_chown((uv_loop_t *)0x0,(uv_fs_t *)(auStack_3b0 + 0x1e8),"test_file",0xffffffff,
                        0xffffffff,(uv_fs_cb)0x0);
    puVar7 = (uv_loop_t *)sVar2;
    unaff_R14 = (_func_void *)(auStack_3b0 + 0x1e8);
    if (iVar3 != 0) goto LAB_001530e1;
    unaff_R14 = (_func_void *)(auStack_3b0 + 0x1e8);
    if ((uv_loop_t *)uStack_1c8.result != (uv_loop_t *)0x0) goto LAB_001530e6;
    auStack_3b0._480_8_ = (void *)0x152e6a;
    uv_fs_req_cleanup((uv_fs_t *)(auStack_3b0 + 0x1e8));
    puVar5 = (uv_loop_t *)0x0;
    file = (uv_file)sVar2;
    auStack_3b0._480_8_ = (void *)0x152e84;
    iVar3 = uv_fs_fchown((uv_loop_t *)0x0,(uv_fs_t *)(auStack_3b0 + 0x1e8),file,0xffffffff,
                         0xffffffff,(uv_fs_cb)0x0);
    if (iVar3 != 0) goto LAB_001530eb;
    p_Var8 = (_func_void *)(auStack_3b0 + 0x1e8);
    if ((uv_loop_t *)uStack_1c8.result != (uv_loop_t *)0x0) goto LAB_001530f0;
    auStack_3b0._480_8_ = (void *)0x152ea3;
    uv_fs_req_cleanup((uv_fs_t *)(auStack_3b0 + 0x1e8));
    auStack_3b0._480_8_ = (void *)0x152ecb;
    puVar5 = ::loop;
    iVar3 = uv_fs_chown(::loop,(uv_fs_t *)(auStack_3b0 + 0x1e8),"test_file",0xffffffff,0xffffffff,
                        chown_cb);
    if (iVar3 != 0) goto LAB_001530f5;
    auStack_3b0._480_8_ = (void *)0x152ee1;
    puVar5 = ::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    p_Var9 = (_func_void *)(auStack_3b0 + 0x1e8);
    if (chown_cb_count != 1) goto LAB_001530fa;
    chown_cb_count = 0;
    auStack_3b0._480_8_ = (void *)0x152f1a;
    puVar5 = ::loop;
    iVar3 = uv_fs_chown(::loop,(uv_fs_t *)(auStack_3b0 + 0x1e8),"test_file",0,0,chown_root_cb);
    p_Var9 = (_func_void *)(auStack_3b0 + 0x1e8);
    if (iVar3 != 0) goto LAB_001530ff;
    auStack_3b0._480_8_ = (void *)0x152f30;
    puVar5 = ::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    p_Var9 = (_func_void *)(auStack_3b0 + 0x1e8);
    if (chown_cb_count != 1) goto LAB_00153104;
    auStack_3b0._480_8_ = (void *)0x152f60;
    puVar5 = ::loop;
    iVar3 = uv_fs_fchown(::loop,(uv_fs_t *)(auStack_3b0 + 0x1e8),file,0xffffffff,0xffffffff,
                         fchown_cb);
    p_Var9 = (_func_void *)(auStack_3b0 + 0x1e8);
    if (iVar3 != 0) goto LAB_00153109;
    auStack_3b0._480_8_ = (void *)0x152f76;
    puVar5 = ::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    p_Var9 = (_func_void *)(auStack_3b0 + 0x1e8);
    if (fchown_cb_count != 1) goto LAB_0015310e;
    puVar5 = (uv_loop_t *)0x0;
    auStack_3b0._480_8_ = (void *)0x152f9e;
    iVar3 = uv_fs_link((uv_loop_t *)0x0,(uv_fs_t *)(auStack_3b0 + 0x1e8),"test_file",
                       "test_file_link",(uv_fs_cb)0x0);
    p_Var9 = (_func_void *)(auStack_3b0 + 0x1e8);
    if (iVar3 != 0) goto LAB_00153113;
    p_Var9 = (_func_void *)(auStack_3b0 + 0x1e8);
    if ((uv_loop_t *)uStack_1c8.result != (uv_loop_t *)0x0) goto LAB_00153118;
    auStack_3b0._480_8_ = (void *)0x152fbd;
    uv_fs_req_cleanup((uv_fs_t *)(auStack_3b0 + 0x1e8));
    puVar5 = (uv_loop_t *)0x0;
    auStack_3b0._480_8_ = (void *)0x152fdc;
    iVar3 = uv_fs_lchown((uv_loop_t *)0x0,(uv_fs_t *)(auStack_3b0 + 0x1e8),"test_file_link",
                         0xffffffff,0xffffffff,(uv_fs_cb)0x0);
    if (iVar3 != 0) goto LAB_0015311d;
    p_Var10 = (_func_void *)(auStack_3b0 + 0x1e8);
    if ((uv_loop_t *)uStack_1c8.result != (uv_loop_t *)0x0) goto LAB_00153122;
    auStack_3b0._480_8_ = (void *)0x152ffb;
    uv_fs_req_cleanup((uv_fs_t *)(auStack_3b0 + 0x1e8));
    auStack_3b0._480_8_ = (void *)0x153023;
    puVar5 = ::loop;
    iVar3 = uv_fs_lchown(::loop,(uv_fs_t *)(auStack_3b0 + 0x1e8),"test_file_link",0xffffffff,
                         0xffffffff,lchown_cb);
    if (iVar3 != 0) goto LAB_00153127;
    auStack_3b0._480_8_ = (void *)0x153039;
    puVar5 = ::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    p_Var11 = (_func_void *)(auStack_3b0 + 0x1e8);
    if (lchown_cb_count != 1) goto LAB_0015312c;
    puVar5 = (uv_loop_t *)0x0;
    auStack_3b0._480_8_ = (void *)0x153054;
    iVar3 = uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)(auStack_3b0 + 0x1e8),file,(uv_fs_cb)0x0);
    p_Var11 = (_func_void *)(auStack_3b0 + 0x1e8);
    if (iVar3 != 0) goto LAB_00153131;
    p_Var11 = (_func_void *)(auStack_3b0 + 0x1e8);
    if ((uv_loop_t *)uStack_1c8.result != (uv_loop_t *)0x0) goto LAB_00153136;
    auStack_3b0._480_8_ = (void *)0x153070;
    uv_fs_req_cleanup((uv_fs_t *)(auStack_3b0 + 0x1e8));
    auStack_3b0._480_8_ = (void *)0x15307e;
    uv_run(::loop,UV_RUN_DEFAULT);
    auStack_3b0._480_8_ = (void *)0x15308a;
    unlink("test_file");
    auStack_3b0._480_8_ = (void *)0x153096;
    unlink("test_file_link");
    auStack_3b0._480_8_ = (void *)0x15309b;
    puVar7 = uv_default_loop();
    auStack_3b0._480_8_ = (void *)0x1530af;
    uv_walk(puVar7,close_walk_cb,(void *)0x0);
    auStack_3b0._480_8_ = (void *)0x1530b9;
    uv_run(puVar7,UV_RUN_DEFAULT);
    auStack_3b0._480_8_ = (void *)0x1530be;
    puVar5 = uv_default_loop();
    auStack_3b0._480_8_ = (void *)0x1530c6;
    iVar3 = uv_loop_close(puVar5);
    p_Var11 = (_func_void *)(auStack_3b0 + 0x1e8);
    if (iVar3 == 0) {
      return 0;
    }
  }
  auStack_3b0._480_8_ = chown_cb;
  run_test_fs_chown_cold_21();
  if (puVar5->backend_fd == 0x1a) {
    if (puVar5->watcher_queue[0] == (void *)0x0) {
      chown_cb_count = chown_cb_count + 1;
      uv_fs_req_cleanup((uv_fs_t *)puVar5);
      return extraout_EAX;
    }
  }
  else {
    auStack_3b0._472_8_ = (void *)0x15315f;
    chown_cb_cold_1();
  }
  auStack_3b0._472_8_ = chown_root_cb;
  chown_cb_cold_2();
  auStack_3b0._472_8_ = puVar7;
  if (puVar5->backend_fd == 0x1a) {
    auStack_3b0._464_8_ = (void *)0x153173;
    req_00 = puVar5;
    _Var4 = geteuid();
    pvVar6 = puVar5->watcher_queue[0];
    if (_Var4 != 0) {
      if (pvVar6 == (void *)0xffffffffffffffff) goto LAB_0015318b;
      auStack_3b0._464_8_ = (void *)0x153186;
      chown_root_cb_cold_2();
    }
    puVar7 = puVar5;
    if (pvVar6 == (void *)0x0) {
LAB_0015318b:
      chown_cb_count = chown_cb_count + 1;
      uv_fs_req_cleanup((uv_fs_t *)puVar5);
      return extraout_EAX_00;
    }
  }
  else {
    auStack_3b0._464_8_ = (void *)0x15319f;
    chown_root_cb_cold_1();
    req_00 = puVar5;
  }
  auStack_3b0._464_8_ = fchown_cb;
  chown_root_cb_cold_3();
  if (req_00->backend_fd == 0x1b) {
    if (req_00->watcher_queue[0] == (void *)0x0) {
      fchown_cb_count = fchown_cb_count + 1;
      uv_fs_req_cleanup((uv_fs_t *)req_00);
      return extraout_EAX_01;
    }
  }
  else {
    auStack_3b0._456_8_ = (uv__io_cb)0x1531c3;
    fchown_cb_cold_1();
  }
  auStack_3b0._456_8_ = lchown_cb;
  fchown_cb_cold_2();
  if (req_00->backend_fd == 0x1e) {
    if (req_00->watcher_queue[0] == (void *)0x0) {
      lchown_cb_count = lchown_cb_count + 1;
      uv_fs_req_cleanup((uv_fs_t *)req_00);
      return extraout_EAX_02;
    }
  }
  else {
    auStack_3b0._448_8_ = (_func_void *)0x1531e7;
    lchown_cb_cold_1();
  }
  auStack_3b0._448_8_ = run_test_fs_link;
  lchown_cb_cold_2();
  puVar5 = (uv_loop_t *)0x194385;
  pcStackY_3c8 = (code *)0x153205;
  auStack_3b0._440_8_ = puVar7;
  auStack_3b0._448_8_ = p_Var11;
  unlink("test_file");
  pcStackY_3c8 = (code *)0x153211;
  unlink("test_file_link");
  pcStackY_3c8 = (code *)0x15321d;
  unlink("test_file_link2");
  pcStackY_3c8 = (code *)0x153222;
  ::loop = uv_default_loop();
  loop = (char *)0x0;
  pcStackY_3c8 = (code *)0x153246;
  iVar3 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)auStack_3b0,"test_file",0x42,0x180,(uv_fs_cb)0x0);
  uVar1 = auStack_3b0._88_8_;
  if (iVar3 < 0) {
    pcStackY_3c8 = (code *)0x153584;
    run_test_fs_link_cold_1();
LAB_00153584:
    pcStackY_3c8 = (code *)0x153589;
    run_test_fs_link_cold_2();
LAB_00153589:
    pcStackY_3c8 = (code *)0x15358e;
    run_test_fs_link_cold_3();
LAB_0015358e:
    pcStackY_3c8 = (code *)0x153593;
    run_test_fs_link_cold_4();
LAB_00153593:
    pcStackY_3c8 = (code *)0x153598;
    run_test_fs_link_cold_5();
LAB_00153598:
    pcStackY_3c8 = (code *)0x15359d;
    run_test_fs_link_cold_6();
LAB_0015359d:
    puVar7 = puVar5;
    pcStackY_3c8 = (code *)0x1535a2;
    run_test_fs_link_cold_7();
LAB_001535a2:
    pcStackY_3c8 = (code *)0x1535a7;
    run_test_fs_link_cold_8();
LAB_001535a7:
    pcStackY_3c8 = (code *)0x1535ac;
    run_test_fs_link_cold_9();
LAB_001535ac:
    pcStackY_3c8 = (code *)0x1535b1;
    run_test_fs_link_cold_10();
LAB_001535b1:
    pcStackY_3c8 = (code *)0x1535b6;
    run_test_fs_link_cold_11();
LAB_001535b6:
    pcStackY_3c8 = (code *)0x1535bb;
    run_test_fs_link_cold_12();
LAB_001535bb:
    pcStackY_3c8 = (code *)0x1535c0;
    run_test_fs_link_cold_13();
LAB_001535c0:
    puVar5 = puVar7;
    pcStackY_3c8 = (code *)0x1535c5;
    run_test_fs_link_cold_14();
LAB_001535c5:
    pcStackY_3c8 = (code *)0x1535ca;
    run_test_fs_link_cold_15();
LAB_001535ca:
    pcStackY_3c8 = (code *)0x1535cf;
    run_test_fs_link_cold_16();
LAB_001535cf:
    pcStackY_3c8 = (code *)0x1535d4;
    run_test_fs_link_cold_17();
LAB_001535d4:
    pcStackY_3c8 = (code *)0x1535d9;
    run_test_fs_link_cold_18();
  }
  else {
    puVar5 = (uv_loop_t *)auStack_3b0._88_8_;
    if ((long)auStack_3b0._88_8_ < 0) goto LAB_00153584;
    pcStackY_3c8 = (code *)0x153269;
    uv_fs_req_cleanup((uv_fs_t *)auStack_3b0);
    pcStackY_3c8 = (code *)0x15327a;
    iov = uv_buf_init(test_buf,0xd);
    loop = (char *)0x0;
    pcStackY_3c8 = (code *)0x1532b0;
    iVar3 = uv_fs_write((uv_loop_t *)0x0,(uv_fs_t *)auStack_3b0,(uv_file)uVar1,&iov,1,-1,
                        (uv_fs_cb)0x0);
    puVar5 = (uv_loop_t *)uVar1;
    if (iVar3 != 0xd) goto LAB_00153589;
    if ((uv_loop_t *)auStack_3b0._88_8_ != (uv_loop_t *)0xd) goto LAB_0015358e;
    pcStackY_3c8 = (code *)0x1532d2;
    uv_fs_req_cleanup((uv_fs_t *)auStack_3b0);
    pcStackY_3c8 = (code *)0x1532e5;
    uv_fs_close(::loop,(uv_fs_t *)auStack_3b0,(uv_file)uVar1,(uv_fs_cb)0x0);
    loop = (char *)0x0;
    pcStackY_3c8 = (code *)0x153300;
    iVar3 = uv_fs_link((uv_loop_t *)0x0,(uv_fs_t *)auStack_3b0,"test_file","test_file_link",
                       (uv_fs_cb)0x0);
    if (iVar3 != 0) goto LAB_00153593;
    if ((uv_loop_t *)auStack_3b0._88_8_ != (uv_loop_t *)0x0) goto LAB_00153598;
    pcStackY_3c8 = (code *)0x153321;
    uv_fs_req_cleanup((uv_fs_t *)auStack_3b0);
    loop = (char *)0x0;
    pcStackY_3c8 = (code *)0x15333d;
    iVar3 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)auStack_3b0,"test_file_link",2,0,(uv_fs_cb)0x0);
    puVar7 = (uv_loop_t *)auStack_3b0._88_8_;
    puVar5 = (uv_loop_t *)auStack_3b0;
    if (iVar3 < 0) goto LAB_0015359d;
    if ((long)auStack_3b0._88_8_ < 0) goto LAB_001535a2;
    pcStackY_3c8 = (code *)0x153360;
    uv_fs_req_cleanup((uv_fs_t *)auStack_3b0);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    pcStackY_3c8 = (code *)0x153382;
    uVar12 = uv_buf_init(buf,0x20);
    loop = (char *)0x0;
    pcStackY_3c8 = (code *)0x1533b4;
    iov = uVar12;
    iVar3 = uv_fs_read((uv_loop_t *)0x0,(uv_fs_t *)auStack_3b0,(uv_file)puVar7,&iov,1,0,
                       (uv_fs_cb)0x0);
    if (iVar3 < 0) goto LAB_001535a7;
    if ((long)auStack_3b0._88_8_ < 0) goto LAB_001535ac;
    loop = buf;
    pcStackY_3c8 = (code *)0x1533db;
    iVar3 = strcmp(buf,test_buf);
    if (iVar3 != 0) goto LAB_001535b1;
    pcStackY_3c8 = (code *)0x1533ea;
    close((uv_file)puVar7);
    pcStackY_3c8 = (code *)0x153410;
    loop = (char *)::loop;
    iVar3 = uv_fs_link(::loop,(uv_fs_t *)auStack_3b0,"test_file","test_file_link2",link_cb);
    if (iVar3 != 0) goto LAB_001535b6;
    pcStackY_3c8 = (code *)0x153426;
    loop = (char *)::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    if (link_cb_count != 1) goto LAB_001535bb;
    loop = (char *)0x0;
    pcStackY_3c8 = (code *)0x153451;
    iVar3 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)auStack_3b0,"test_file_link2",2,0,(uv_fs_cb)0x0);
    puVar5 = (uv_loop_t *)auStack_3b0._88_8_;
    if (iVar3 < 0) goto LAB_001535c0;
    if ((long)auStack_3b0._88_8_ < 0) goto LAB_001535c5;
    pcStackY_3c8 = (code *)0x153474;
    uv_fs_req_cleanup((uv_fs_t *)auStack_3b0);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    pcStackY_3c8 = (code *)0x153496;
    uVar12 = uv_buf_init(buf,0x20);
    loop = (char *)0x0;
    pcStackY_3c8 = (code *)0x1534c8;
    iov = uVar12;
    iVar3 = uv_fs_read((uv_loop_t *)0x0,(uv_fs_t *)auStack_3b0,(uv_file)puVar5,&iov,1,0,
                       (uv_fs_cb)0x0);
    if (iVar3 < 0) goto LAB_001535ca;
    if ((long)auStack_3b0._88_8_ < 0) goto LAB_001535cf;
    loop = buf;
    pcStackY_3c8 = (code *)0x1534ef;
    iVar3 = strcmp(buf,test_buf);
    if (iVar3 != 0) goto LAB_001535d4;
    pcStackY_3c8 = (code *)0x15350c;
    uv_fs_close(::loop,(uv_fs_t *)auStack_3b0,(uv_file)puVar5,(uv_fs_cb)0x0);
    pcStackY_3c8 = (code *)0x15351a;
    uv_run(::loop,UV_RUN_DEFAULT);
    pcStackY_3c8 = (code *)0x153526;
    unlink("test_file");
    pcStackY_3c8 = (code *)0x153532;
    unlink("test_file_link");
    pcStackY_3c8 = (code *)0x15353e;
    unlink("test_file_link2");
    pcStackY_3c8 = (code *)0x153543;
    puVar5 = uv_default_loop();
    pcStackY_3c8 = (code *)0x153557;
    uv_walk(puVar5,close_walk_cb,(void *)0x0);
    pcStackY_3c8 = (code *)0x153561;
    uv_run(puVar5,UV_RUN_DEFAULT);
    pcStackY_3c8 = (code *)0x153566;
    loop = (char *)uv_default_loop();
    pcStackY_3c8 = (code *)0x15356e;
    iVar3 = uv_loop_close((uv_loop_t *)loop);
    if (iVar3 == 0) {
      return 0;
    }
  }
  pcStackY_3c8 = link_cb;
  run_test_fs_link_cold_19();
  if (((uv_loop_t *)loop)->backend_fd == 0x17) {
    if (((uv_loop_t *)loop)->watcher_queue[0] == (void *)0x0) {
      link_cb_count = link_cb_count + 1;
      uv_fs_req_cleanup((uv_fs_t *)loop);
      return extraout_EAX_03;
    }
  }
  else {
    puStackY_3d0 = (uv_loop_t *)0x1535fd;
    link_cb_cold_1();
  }
  puStackY_3d0 = (uv_loop_t *)run_test_fs_readlink;
  link_cb_cold_2();
  puStackY_3d0 = puVar5;
  ::loop = uv_default_loop();
  iVar3 = uv_fs_readlink(::loop,&uStackY_588,"no_such_file",dummy_cb);
  if (iVar3 == 0) {
    iVar3 = uv_run(::loop,UV_RUN_DEFAULT);
    if (iVar3 != 0) goto LAB_001536f7;
    if (dummy_cb_count != 1) goto LAB_001536fc;
    if (uStackY_588.ptr != (void *)0x0) goto LAB_00153701;
    if (uStackY_588.result != -2) goto LAB_00153706;
    uv_fs_req_cleanup(&uStackY_588);
    iVar3 = uv_fs_readlink((uv_loop_t *)0x0,&uStackY_588,"no_such_file",(uv_fs_cb)0x0);
    if (iVar3 != -2) goto LAB_0015370b;
    if (uStackY_588.ptr != (void *)0x0) goto LAB_00153710;
    if (uStackY_588.result == -2) {
      uv_fs_req_cleanup(&uStackY_588);
      puVar7 = uv_default_loop();
      uv_walk(puVar7,close_walk_cb,(void *)0x0);
      uv_run(puVar7,UV_RUN_DEFAULT);
      puVar7 = uv_default_loop();
      iVar3 = uv_loop_close(puVar7);
      if (iVar3 == 0) {
        return 0;
      }
      goto LAB_0015371a;
    }
  }
  else {
    run_test_fs_readlink_cold_1();
LAB_001536f7:
    run_test_fs_readlink_cold_2();
LAB_001536fc:
    run_test_fs_readlink_cold_3();
LAB_00153701:
    run_test_fs_readlink_cold_4();
LAB_00153706:
    run_test_fs_readlink_cold_5();
LAB_0015370b:
    run_test_fs_readlink_cold_6();
LAB_00153710:
    run_test_fs_readlink_cold_7();
  }
  run_test_fs_readlink_cold_8();
LAB_0015371a:
  run_test_fs_readlink_cold_9();
  dummy_cb_count = dummy_cb_count + 1;
  return extraout_EAX_04;
}

Assistant:

TEST_IMPL(fs_chown) {
  int r;
  uv_fs_t req;
  uv_file file;

  /* Setup. */
  unlink("test_file");
  unlink("test_file_link");

  loop = uv_default_loop();

  r = uv_fs_open(NULL, &req, "test_file", O_RDWR | O_CREAT,
      S_IWUSR | S_IRUSR, NULL);
  ASSERT(r >= 0);
  ASSERT(req.result >= 0);
  file = req.result;
  uv_fs_req_cleanup(&req);

  /* sync chown */
  r = uv_fs_chown(NULL, &req, "test_file", -1, -1, NULL);
  ASSERT(r == 0);
  ASSERT(req.result == 0);
  uv_fs_req_cleanup(&req);

  /* sync fchown */
  r = uv_fs_fchown(NULL, &req, file, -1, -1, NULL);
  ASSERT(r == 0);
  ASSERT(req.result == 0);
  uv_fs_req_cleanup(&req);

  /* async chown */
  r = uv_fs_chown(loop, &req, "test_file", -1, -1, chown_cb);
  ASSERT(r == 0);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(chown_cb_count == 1);

#ifndef __MVS__
  /* chown to root (fail) */
  chown_cb_count = 0;
  r = uv_fs_chown(loop, &req, "test_file", 0, 0, chown_root_cb);
  ASSERT(r == 0);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(chown_cb_count == 1);
#endif

  /* async fchown */
  r = uv_fs_fchown(loop, &req, file, -1, -1, fchown_cb);
  ASSERT(r == 0);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(fchown_cb_count == 1);

#ifndef __HAIKU__
  /* Haiku doesn't support hardlink */
  /* sync link */
  r = uv_fs_link(NULL, &req, "test_file", "test_file_link", NULL);
  ASSERT(r == 0);
  ASSERT(req.result == 0);
  uv_fs_req_cleanup(&req);

  /* sync lchown */
  r = uv_fs_lchown(NULL, &req, "test_file_link", -1, -1, NULL);
  ASSERT(r == 0);
  ASSERT(req.result == 0);
  uv_fs_req_cleanup(&req);

  /* async lchown */
  r = uv_fs_lchown(loop, &req, "test_file_link", -1, -1, lchown_cb);
  ASSERT(r == 0);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(lchown_cb_count == 1);
#endif

  /* Close file */
  r = uv_fs_close(NULL, &req, file, NULL);
  ASSERT(r == 0);
  ASSERT(req.result == 0);
  uv_fs_req_cleanup(&req);

  /*
   * Run the loop just to check we don't have make any extraneous uv_ref()
   * calls. This should drop out immediately.
   */
  uv_run(loop, UV_RUN_DEFAULT);

  /* Cleanup. */
  unlink("test_file");
  unlink("test_file_link");

  MAKE_VALGRIND_HAPPY();
  return 0;
}